

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  ostream *poVar1;
  Message ss;
  undefined8 uVar2;
  bool bVar3;
  char *str;
  char *in_RDX;
  Int32 IVar4;
  Int32 result;
  string env_var;
  Int32 local_74;
  Message local_70;
  undefined1 local_68 [32];
  string local_48;
  
  FlagToEnvVar_abi_cxx11_(&local_48,(internal *)flag,in_RDX);
  str = getenv(local_48._M_dataplus._M_p);
  IVar4 = default_value;
  if (str != (char *)0x0) {
    local_74 = default_value;
    Message::Message((Message *)local_68);
    uVar2 = local_68._0_8_;
    poVar1 = (ostream *)(local_68._0_8_ + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Environment variable ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
    bVar3 = ParseInt32((Message *)local_68,str,&local_74);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar2 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)uVar2 + 8))(uVar2);
      local_68._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    IVar4 = local_74;
    if (!bVar3) {
      Message::Message(&local_70);
      ss.ss_.ptr_ = local_70.ss_.ptr_;
      std::ostream::operator<<((ostream *)((long)local_70.ss_.ptr_ + 0x10),default_value);
      StringStreamToString((string *)local_68,(stringstream *)ss.ss_.ptr_);
      printf("The default value %s is used.\n",local_68._0_8_);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_68 + 0x10)) {
        operator_delete((void *)local_68._0_8_);
      }
      if (ss.ss_.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)ss.ss_.ptr_ + 8))(ss.ss_.ptr_);
        local_70.ss_.ptr_ =
             (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      fflush(_stdout);
      IVar4 = default_value;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return IVar4;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
}